

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<QPdfEnginePrivate::AttachmentInfo>::moveAppend
          (QGenericArrayOps<QPdfEnginePrivate::AttachmentInfo> *this,AttachmentInfo *b,
          AttachmentInfo *e)

{
  AttachmentInfo *pAVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  Data *pDVar5;
  char *pcVar6;
  qsizetype qVar7;
  
  if ((b != e) && (b < e)) {
    pAVar1 = (this->super_QArrayDataPointer<QPdfEnginePrivate::AttachmentInfo>).ptr;
    qVar7 = (this->super_QArrayDataPointer<QPdfEnginePrivate::AttachmentInfo>).size;
    do {
      pDVar2 = (b->fileName).d.d;
      (b->fileName).d.d = (Data *)0x0;
      pAVar1[qVar7].fileName.d.d = pDVar2;
      pcVar3 = (b->fileName).d.ptr;
      (b->fileName).d.ptr = (char16_t *)0x0;
      pAVar1[qVar7].fileName.d.ptr = pcVar3;
      qVar4 = (b->fileName).d.size;
      (b->fileName).d.size = 0;
      pAVar1[qVar7].fileName.d.size = qVar4;
      pDVar5 = (b->data).d.d;
      (b->data).d.d = (Data *)0x0;
      pAVar1[qVar7].data.d.d = pDVar5;
      pcVar6 = (b->data).d.ptr;
      (b->data).d.ptr = (char *)0x0;
      pAVar1[qVar7].data.d.ptr = pcVar6;
      qVar4 = (b->data).d.size;
      (b->data).d.size = 0;
      pAVar1[qVar7].data.d.size = qVar4;
      pDVar2 = (b->mimeType).d.d;
      (b->mimeType).d.d = (Data *)0x0;
      pAVar1[qVar7].mimeType.d.d = pDVar2;
      pcVar3 = (b->mimeType).d.ptr;
      (b->mimeType).d.ptr = (char16_t *)0x0;
      pAVar1[qVar7].mimeType.d.ptr = pcVar3;
      qVar4 = (b->mimeType).d.size;
      (b->mimeType).d.size = 0;
      pAVar1[qVar7].mimeType.d.size = qVar4;
      b = b + 1;
      qVar7 = (this->super_QArrayDataPointer<QPdfEnginePrivate::AttachmentInfo>).size + 1;
      (this->super_QArrayDataPointer<QPdfEnginePrivate::AttachmentInfo>).size = qVar7;
    } while (b < e);
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }